

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int lhConsumeCellData(lhcell *pCell,_func_int_void_ptr_uint_void_ptr *xConsumer,void *pUserData)

{
  lhash_kv_engine *plVar1;
  unqlite_page *puVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  unqlite_kv_io *puVar6;
  bool bVar7;
  ulong uVar8;
  uchar *puVar9;
  sxu64 sVar10;
  unqlite_page *pOvfl;
  void *local_40;
  pgno iOvfl;
  
  if (pCell->iOvfl == 0) {
    iVar5 = (*xConsumer)(pCell->pPage->pRaw->zData +
                         (ulong)(pCell->nKey + 0x1a) + (ulong)pCell->iStart,(uint)pCell->nData,
                         pUserData);
    iVar3 = -10;
    if (iVar5 == 0) {
      iVar3 = 0;
    }
  }
  else {
    plVar1 = pCell->pPage->pHash;
    sVar10 = pCell->nData;
    iOvfl = pCell->iDataPage;
    bVar7 = true;
    local_40 = pUserData;
    while ((iOvfl != 0 && (sVar10 != 0))) {
      iVar3 = (*plVar1->pIo->xGet)(plVar1->pIo->pHandle,iOvfl,&pOvfl);
      if (iVar3 != 0) {
        return iVar3;
      }
      if (bVar7) {
        puVar9 = pOvfl->zData + pCell->iDataOfft;
        uVar4 = plVar1->iPageSize - (uint)pCell->iDataOfft;
      }
      else {
        puVar9 = pOvfl->zData + 8;
        uVar4 = plVar1->iPageSize - 8;
      }
      uVar8 = (ulong)uVar4;
      if (sVar10 < uVar8 || sVar10 - uVar8 == 0) {
        iVar3 = (*xConsumer)(puVar9,(uint)sVar10,local_40);
        if (iVar3 != 0) {
          puVar6 = plVar1->pIo;
          goto LAB_00113c9a;
        }
        sVar10 = 0;
      }
      else if ((uVar8 != 0) &&
              (iVar3 = (*xConsumer)(puVar9,uVar4,local_40), sVar10 = sVar10 - uVar8, iVar3 != 0)) {
        puVar6 = plVar1->pIo;
LAB_00113c9a:
        (*puVar6->xPageUnref)(pOvfl);
        return -10;
      }
      puVar2 = pOvfl;
      SyBigEndianUnpack64(pOvfl->zData,&iOvfl);
      (*plVar1->pIo->xPageUnref)(puVar2);
      bVar7 = false;
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int lhConsumeCellData(
	lhcell *pCell, /* Target cell */
	int (*xConsumer)(const void *,unsigned int,void *), /* Data consumer callback */
	void *pUserData /* Last argument to xConsumer() */
	)
{
	lhpage *pPage = pCell->pPage;
	const unsigned char *zRaw = pPage->pRaw->zData;
	const unsigned char *zPayload;
	int rc;
	/* Point to the payload area */
	zPayload = &zRaw[pCell->iStart];
	if( pCell->iOvfl == 0 ){
		/* Best scenario, consume the data directly without any overflow page */
		zPayload += L_HASH_CELL_SZ + pCell->nKey;
		rc = xConsumer((const void *)zPayload,(sxu32)pCell->nData,pUserData);
		if( rc != UNQLITE_OK ){
			rc = UNQLITE_ABORT;
		}
	}else{
		lhash_kv_engine *pEngine = pPage->pHash;
		sxu64 nData = pCell->nData;
		unqlite_page *pOvfl;
		int fix_offset = 0;
		sxu32 nByte;
		pgno iOvfl;
		/* Overflow page where data is stored */
		iOvfl = pCell->iDataPage;
		for(;;){
			if( iOvfl == 0 || nData < 1 ){
				/* no more overflow page */
				break;
			}
			/* Point to the overflow page */
			rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,iOvfl,&pOvfl);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			/* Point to the raw content */
			zPayload = pOvfl->zData;
			if( !fix_offset ){
				/* Point to the data */
				zPayload += pCell->iDataOfft;
				nByte = pEngine->iPageSize - pCell->iDataOfft;
				fix_offset = 1;
			}else{
				zPayload += 8;
				/* Total usable bytes in an overflow page */
				nByte = L_HASH_OVERFLOW_SIZE(pEngine->iPageSize);
			}
			/* Consume the data */
			if( nData <= (sxu64)nByte ){
				rc = xConsumer((const void *)zPayload,(unsigned int)nData,pUserData);
				if( rc != UNQLITE_OK ){
					pEngine->pIo->xPageUnref(pOvfl);
					return UNQLITE_ABORT;
				}
				nData = 0;
			}else{
				if( nByte > 0 ){
					rc = xConsumer((const void *)zPayload,nByte,pUserData);
					if( rc != UNQLITE_OK ){
						pEngine->pIo->xPageUnref(pOvfl);
						return UNQLITE_ABORT;
					}
					nData -= nByte;
				}
			}
			/* Next overflow page in the chain */
			SyBigEndianUnpack64(pOvfl->zData,&iOvfl);
			/* Unref the page */
			pEngine->pIo->xPageUnref(pOvfl);
		}
		rc = UNQLITE_OK;
	}
	return rc;
}